

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VkBootstrap.cpp
# Opt level: O0

char * vkb::to_string(SwapchainError err)

{
  char *pcStack_10;
  SwapchainError err_local;
  
  switch(err) {
  case surface_handle_not_provided:
    pcStack_10 = "surface_handle_not_provided";
    break;
  case failed_query_surface_support_details:
    pcStack_10 = "failed_query_surface_support_details";
    break;
  case failed_create_swapchain:
    pcStack_10 = "failed_create_swapchain";
    break;
  case failed_get_swapchain_images:
    pcStack_10 = "failed_get_swapchain_images";
    break;
  case failed_create_swapchain_image_views:
    pcStack_10 = "failed_create_swapchain_image_views";
    break;
  case required_min_image_count_too_low:
    pcStack_10 = "required_min_image_count_too_low";
    break;
  case required_usage_not_supported:
    pcStack_10 = "required_usage_not_supported";
    break;
  default:
    pcStack_10 = "";
  }
  return pcStack_10;
}

Assistant:

const char* to_string(SwapchainError err) {
    switch (err) {
        CASE_TO_STRING(SwapchainError, surface_handle_not_provided)
        CASE_TO_STRING(SwapchainError, failed_query_surface_support_details)
        CASE_TO_STRING(SwapchainError, failed_create_swapchain)
        CASE_TO_STRING(SwapchainError, failed_get_swapchain_images)
        CASE_TO_STRING(SwapchainError, failed_create_swapchain_image_views)
        CASE_TO_STRING(SwapchainError, required_min_image_count_too_low)
        CASE_TO_STRING(SwapchainError, required_usage_not_supported)
        default:
            return "";
    }
}